

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall duckdb::BaseAppender::Close(BaseAppender *this)

{
  vector<duckdb::LogicalType,_true> *pvVar1;
  
  if (this->column != 0) {
    pvVar1 = &this->active_types;
    if ((this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
        .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
        .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar1 = &this->types;
    }
    if (this->column !=
        ((long)(pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
      return;
    }
  }
  Flush(this);
  return;
}

Assistant:

void BaseAppender::Close() {
	if (column == 0 || column == GetActiveTypes().size()) {
		Flush();
	}
}